

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

ChainType __thiscall ArgsManager::GetChainType(ArgsManager *this)

{
  long lVar1;
  runtime_error *this_00;
  variant_alternative_t<1UL,_variant<ChainType,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string sStack_68;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetChainArg_abi_cxx11_(&arg,this);
  if (arg.
      super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_index == '\0') {
    std::__detail::__variant::
    _Variant_storage<false,_ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&arg);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (ChainType)
             arg.
             super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
             super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
             super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u.
             _M_first._M_storage;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    fmt = std::get<1ul,ChainType,std::__cxx11::string>(&arg);
    tinyformat::format<std::__cxx11::string>
              (&sStack_68,(tinyformat *)"Unknown chain %s.",(char *)fmt,in_RCX);
    std::runtime_error::runtime_error(this_00,(string *)&sStack_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

ChainType ArgsManager::GetChainType() const
{
    std::variant<ChainType, std::string> arg = GetChainArg();
    if (auto* parsed = std::get_if<ChainType>(&arg)) return *parsed;
    throw std::runtime_error(strprintf("Unknown chain %s.", std::get<std::string>(arg)));
}